

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void send_additional_header(mg_connection *conn)

{
  char *http1_headers;
  char *header;
  mg_connection *conn_local;
  
  http1_headers = conn->dom_ctx->config[0x38];
  if ((http1_headers != (char *)0x0) && (*http1_headers != '\0')) {
    mg_response_header_add_lines(conn,http1_headers);
  }
  return;
}

Assistant:

static void
send_additional_header(struct mg_connection *conn)
{
	const char *header = conn->dom_ctx->config[ADDITIONAL_HEADER];

#if !defined(NO_SSL)
	if (conn->dom_ctx->config[STRICT_HTTPS_MAX_AGE]) {
		long max_age = atol(conn->dom_ctx->config[STRICT_HTTPS_MAX_AGE]);
		if (max_age >= 0) {
			char val[64];
			mg_snprintf(conn,
			            NULL,
			            val,
			            sizeof(val),
			            "max-age=%lu",
			            (unsigned long)max_age);
			mg_response_header_add(conn, "Strict-Transport-Security", val, -1);
		}
	}
#endif

	if (header && header[0]) {
		mg_response_header_add_lines(conn, header);
	}
}